

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_0000_0999.cpp
# Opt level: O2

void __thiscall psy::C::ParserTester::case0028(ParserTester *this)

{
  string text;
  Expectation X;
  Expectation *pEVar1;
  initializer_list<psy::C::SyntaxKind> __l;
  undefined1 in_stack_fffffffffffffe18 [40];
  undefined8 uVar2;
  undefined1 in_stack_fffffffffffffe48 [32];
  undefined8 in_stack_fffffffffffffe68;
  anon_union_8_2_2d0bec1f_for_MacroTranslations_0 in_stack_fffffffffffffe70;
  anon_union_8_2_2d0bec1f_for_LanguageExtensions_1 in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe88 [72];
  ParseOptions in_stack_fffffffffffffed0;
  Expectation local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffe48,"const int ;",
             (allocator<char> *)&stack0xfffffffffffffe27);
  Expectation::Expectation((Expectation *)&stack0xfffffffffffffe88);
  uVar2 = 0x40103fd03e903e8;
  __l._M_len = 4;
  __l._M_array = (iterator)&stack0xfffffffffffffe40;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            ((vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
             &stack0xfffffffffffffe28,__l,(allocator_type *)&stack0xfffffffffffffe26);
  pEVar1 = Expectation::AST((Expectation *)&stack0xfffffffffffffe88,
                            (vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
                            &stack0xfffffffffffffe28);
  Expectation::Expectation(&local_c0,pEVar1);
  ParseOptions::ParseOptions((ParseOptions *)&stack0xfffffffffffffe68);
  text._M_string_length = in_stack_fffffffffffffe70.BF_all_;
  text._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe68;
  text.field_2._M_allocated_capacity = in_stack_fffffffffffffe78.BF_all_;
  text.field_2._8_8_ = in_stack_fffffffffffffe80;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)uVar2;
  X.numE_ = in_stack_fffffffffffffe18._0_4_;
  X.numW_ = in_stack_fffffffffffffe18._4_4_;
  X.descriptorsE_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffe18._8_24_;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe18._32_8_;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffe48._0_8_;
  X.continueTestDespiteOfErrors_ = (bool)in_stack_fffffffffffffe48[8];
  X.containsAmbiguity_ = (bool)in_stack_fffffffffffffe48[9];
  X._58_6_ = in_stack_fffffffffffffe48._10_6_;
  X.ambiguityText_._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe48._16_8_;
  X.ambiguityText_._M_string_length = in_stack_fffffffffffffe48._24_8_;
  X.ambiguityText_.field_2._M_allocated_capacity = in_stack_fffffffffffffe68;
  X.ambiguityText_.field_2._8_8_ = in_stack_fffffffffffffe70.BF_all_;
  X._96_8_ = in_stack_fffffffffffffe78.BF_all_;
  X.syntaxKinds_.super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe80;
  X.syntaxKinds_.super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe88._0_8_;
  X.syntaxKinds_.super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffe88._8_8_;
  X.declarations_.super__Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>)
       (_Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>)in_stack_fffffffffffffe88._16_24_;
  X.checkScope_ = (bool)in_stack_fffffffffffffe88[0x28];
  X._153_7_ = in_stack_fffffffffffffe88._41_7_;
  X.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data =
       (_Vector_base<int,_std::allocator<int>_>)
       (_Vector_base<int,_std::allocator<int>_>)in_stack_fffffffffffffe88._48_24_;
  parse(this,text,X,(SyntaxCategory)&stack0xfffffffffffffe48,in_stack_fffffffffffffed0);
  Expectation::~Expectation(&local_c0);
  std::_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~_Vector_base
            ((_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
             &stack0xfffffffffffffe28);
  Expectation::~Expectation((Expectation *)&stack0xfffffffffffffe88);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe48);
  return;
}

Assistant:

void ParserTester::case0028()
{
    // Not a syntactic error, but diagnoses a semantic warning.
    CROSS_REFERENCE_TEST(DeclarationBinderTester::case0001) ;

    parse("const int ;",
          Expectation().AST({ SyntaxKind::TranslationUnit,
                              SyntaxKind::IncompleteDeclaration,
                              SyntaxKind::ConstQualifier,
                              SyntaxKind::BasicTypeSpecifier }));
}